

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Type *out_type)

{
  uint uVar1;
  WastParseOptions WVar2;
  bool bVar3;
  Type TVar4;
  Result RVar5;
  char *format;
  long lVar6;
  allocator local_11e;
  allocator local_11d;
  allocator local_11c;
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  char *local_118;
  size_type sStack_110;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_108;
  undefined8 uStack_100;
  Type type;
  undefined4 uStack_f4;
  Token token;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  bVar3 = PeekMatch(this,First_Type);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&token,"i32",&local_119);
    std::__cxx11::string::string((string *)&token.token_type_,"i64",&local_11a);
    std::__cxx11::string::string(local_98,"f32",&local_11b);
    std::__cxx11::string::string(local_78,"f64",&local_11c);
    std::__cxx11::string::string(local_58,"v128",&local_11d);
    std::__cxx11::string::string(local_38,"anyref",&local_11e);
    _type = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&type,&token,
               &stack0xffffffffffffffe8);
    RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&type,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&type);
    lVar6 = 0xa0;
    do {
      std::__cxx11::string::_M_dispose();
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    return (Result)RVar5.enum_;
  }
  Consume(&token,this);
  TVar4 = Token::type(&token);
  _type = CONCAT44(uStack_f4,TVar4.enum_);
  uVar1 = TVar4.enum_ + ~(Func|I32U);
  if (uVar1 < 0x1b) {
    if ((0x4000181U >> (uVar1 & 0x1f) & 1) == 0) {
      if (uVar1 != 0x13) goto LAB_00166d80;
      WVar2 = this->options_[4];
    }
    else {
      WVar2 = this->options_[9];
    }
    if (WVar2 == (WastParseOptions)0x0) {
      local_108.offset = (size_t)token.loc.field_1.field_1.offset;
      uStack_100 = token.loc.field_1._8_8_;
      local_118 = token.loc.filename.data_;
      sStack_110 = token.loc.filename.size_;
      format = Type::GetName(&type);
      Error(this,0x1a9d48,format);
      return (Result)Error;
    }
  }
LAB_00166d80:
  out_type->enum_ = (Enum)TVar4;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueType(Type* out_type) {
  WABT_TRACE(ParseValueType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"i32", "i64", "f32", "f64", "v128", "anyref"});
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::Anyref:
    case Type::Funcref:
    case Type::Hostref:
    case Type::Exnref:
      is_enabled = options_->features.reference_types_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}